

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
vkt::pipeline::anon_unknown_0::genFullQuadVertices
          (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           *__return_storage_ptr__,int subpassCount)

{
  Vector<float,_4> local_6c;
  Vector<float,_4> local_5c;
  Vector<float,_4> local_4c [2];
  Vector<float,_4> local_2c;
  int local_1c;
  undefined1 local_15;
  int subpassNdx;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvStack_10;
  int subpassCount_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vectorData;
  
  local_15 = 0;
  subpassNdx = subpassCount;
  pvStack_10 = __return_storage_ptr__;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (__return_storage_ptr__);
  for (local_1c = 0; local_1c < subpassNdx; local_1c = local_1c + 1) {
    tcu::Vector<float,_4>::Vector(&local_2c,-1.0,-1.0,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (__return_storage_ptr__,&local_2c);
    tcu::Vector<float,_4>::Vector(local_4c,-1.0,1.0,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (__return_storage_ptr__,local_4c);
    tcu::Vector<float,_4>::Vector(&local_5c,1.0,-1.0,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (__return_storage_ptr__,&local_5c);
    tcu::Vector<float,_4>::Vector(&local_6c,1.0,1.0,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (__return_storage_ptr__,&local_6c);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Vertex4RGBA> genFullQuadVertices (const int subpassCount)
{
	vector<Vertex4RGBA>	vectorData;
	for (int subpassNdx = 0; subpassNdx < subpassCount; ++subpassNdx)
	{
		Vertex4RGBA data =
		{
			Vec4(0.0f, -1.0f, 0.0f, 1.0f),
			COLOR_TABLE[subpassNdx % DE_LENGTH_OF_ARRAY(COLOR_TABLE)],
		};
		vectorData.push_back(data);
		data.position	= Vec4(0.0f,  1.0f, 0.0f, 1.0f);
		vectorData.push_back(data);
		data.position	= Vec4(1.0f, -1.0f, 0.0f, 1.0f);
		vectorData.push_back(data);
		data.position	= Vec4(1.0f,  1.0f, 0.0f, 1.0f);
		vectorData.push_back(data);
	}
	return vectorData;
}